

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_string.hpp
# Opt level: O2

bool __thiscall
chaiscript::utility::Static_String::operator==(Static_String *this,string_view other)

{
  size_t sVar1;
  bool bVar2;
  
  if (this->m_size == other._M_len) {
    for (sVar1 = 0;
        (bVar2 = this->m_size == sVar1, !bVar2 && (this->data[sVar1] == other._M_str[sVar1]));
        sVar1 = sVar1 + 1) {
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

constexpr bool operator==(std::string_view other) const noexcept {
      // return std::string_view(data, m_size) == other;
      auto b1 = begin();
      const auto e1 = end();
      auto b2 = other.begin();
      const auto e2 = other.end();

      if (e1 - b1 != e2 - b2) {
        return false;
      }

      while (b1 != e1) {
        if (*b1 != *b2) {
          return false;
        }
        ++b1;
        ++b2;
      }
      return true;
    }